

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

void printarrayblock(LispPTR base)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  
  if ((base & 1) == 0) {
    puVar3 = (uint *)(Lisp_world + base);
    puVar2 = (uint *)(Lisp_world + ((base + (uint)(ushort)*puVar3 * 2) - 2));
  }
  else {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)base);
    puVar3 = (uint *)(Lisp_world + base);
    uVar1 = (base + (uint)(ushort)*puVar3 * 2) - 2;
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
    puVar2 = (uint *)(Lisp_world + uVar1);
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)(base - 2));
  }
  printf("This array block: 0x%x.  Previous: 0x%x.  Next: 0x%x.\n",(ulong)base,
         (ulong)(base + (uint)Lisp_world[base - 2] * -2),(ulong)(base + (uint)(ushort)*puVar3 * 2));
  printf("          Length: %d cells.\n\n",(ulong)(ushort)*puVar3);
  lVar4 = -0x50;
  do {
    printf("%16p %8x\n",(long)puVar3 + lVar4,(ulong)*(uint *)((long)puVar3 + lVar4));
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  printf("%16p %8x <- array header\n",puVar3,(ulong)*puVar3);
  lVar4 = 4;
  do {
    printf("%16p %8x\n",(long)puVar3 + lVar4,(ulong)*(uint *)((long)puVar3 + lVar4));
    uVar5 = lVar4 - 4;
    lVar4 = lVar4 + 4;
  } while (uVar5 < 0x48);
  puts(". . .");
  lVar4 = -0x50;
  do {
    printf("%16p %8x\n",(long)puVar2 + lVar4,(ulong)*(uint *)((long)puVar2 + lVar4));
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  printf("%16p %8x <- array trailer\n",puVar2,(ulong)*puVar2);
  lVar4 = 4;
  do {
    printf("%16p %8x\n",(long)puVar2 + lVar4,(ulong)*(uint *)((long)puVar2 + lVar4));
    uVar5 = lVar4 - 4;
    lVar4 = lVar4 + 4;
  } while (uVar5 < 0x48);
  return;
}

Assistant:

void printarrayblock(LispPTR base) {
  struct arrayblock *bbase, *btrailer, *ptrailer;
  LispPTR *addr;

  LispPTR pbase, nbase;

  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  btrailer = (struct arrayblock *)NativeAligned4FromLAddr(Trailer(base, bbase));
  ptrailer = (struct arrayblock *)NativeAligned4FromLAddr(base - ARRAYBLOCKTRAILERWORDS);

  nbase = base + 2 * bbase->arlen;
  pbase = base - 2 * ptrailer->arlen;

  printf("This array block: 0x%x.  Previous: 0x%x.  Next: 0x%x.\n", base, pbase, nbase);
  printf("          Length: %d cells.\n\n", bbase->arlen);

  addr = ((LispPTR *)bbase) - 20;
  for (; addr < (LispPTR *)bbase; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf("%16p %8x <- array header\n", (void *)addr, *addr);
  addr++;
  for (; addr < (LispPTR *)bbase + 20; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf(". . .\n");

  addr = ((LispPTR *)btrailer) - 20;
  for (; addr < (LispPTR *)btrailer; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf("%16p %8x <- array trailer\n", (void *)addr, *addr);
  addr++;
  for (; addr < (LispPTR *)btrailer + 20; addr++) printf("%16p %8x\n", (void *)addr, *addr);
}